

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O1

int omac_acpkm_imit_update(EVP_MD_CTX *ctx,void *data,size_t count)

{
  CMAC_ACPKM_CTX *ctx_00;
  bool bVar1;
  uint inl;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong uVar6;
  ulong __n;
  
  puVar4 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  if (*(int *)(puVar4 + 3) == 0) {
    ERR_GOST_error(0x92,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                   ,0x151);
    return 0;
  }
  ctx_00 = (CMAC_ACPKM_CTX *)*puVar4;
  if (ctx_00->nlast_block == -1) {
    return 0;
  }
  if (count == 0) {
    return 1;
  }
  inl = EVP_CIPHER_CTX_get_block_size(ctx_00->cctx);
  uVar6 = (ulong)(int)inl;
  lVar5 = (long)ctx_00->nlast_block;
  if (lVar5 < 1) goto LAB_00119a65;
  __n = uVar6 - lVar5;
  if (count <= uVar6 - lVar5) {
    __n = count;
  }
  memcpy(ctx_00->last_block + lVar5,data,__n);
  ctx_00->nlast_block = ctx_00->nlast_block + (int)__n;
  iVar3 = 0;
  count = count - __n;
  if (count == 0) {
    iVar3 = 1;
LAB_00119a5a:
    bVar1 = false;
  }
  else {
    data = (void *)((long)data + __n);
    iVar2 = CMAC_ACPKM_Mesh(ctx_00);
    if (iVar2 == 0) goto LAB_00119a5a;
    iVar2 = EVP_Cipher((EVP_CIPHER_CTX *)ctx_00->cctx,ctx_00->tbl,ctx_00->last_block,inl);
    if (iVar2 == 0) {
      iVar3 = 0;
      bVar1 = false;
    }
    else {
      ctx_00->num = ctx_00->num + inl;
      bVar1 = true;
    }
  }
  if (!bVar1) {
    return iVar3;
  }
LAB_00119a65:
  if (uVar6 < count) {
    do {
      iVar3 = CMAC_ACPKM_Mesh(ctx_00);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = EVP_Cipher((EVP_CIPHER_CTX *)ctx_00->cctx,ctx_00->tbl,(uchar *)data,inl);
      if (iVar3 == 0) {
        return 0;
      }
      count = count - uVar6;
      data = (void *)((long)data + uVar6);
      ctx_00->num = ctx_00->num + inl;
    } while (uVar6 < count);
  }
  memcpy(ctx_00->last_block,data,count);
  ctx_00->nlast_block = (int)count;
  return 1;
}

Assistant:

static int omac_acpkm_imit_update(EVP_MD_CTX *ctx, const void *data,
                                  size_t count)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_ACPKM_IMIT_UPDATE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    return CMAC_ACPKM_Update(c->cmac_ctx, data, count);
}